

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O0

Maybe<int> __thiscall capnp::MembraneHook::getFd(MembraneHook *this)

{
  bool bVar1;
  uint uVar2;
  ClientHook *pCVar3;
  NullableValue<int> *other;
  int *piVar4;
  MembranePolicy *pMVar5;
  long in_RSI;
  int *f;
  Maybe<int> local_28;
  NullableValue<int> local_20;
  NullableValue<int> _f530;
  MembraneHook *this_local;
  
  pCVar3 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->
                     ((Own<capnp::ClientHook,_std::nullptr_t> *)(in_RSI + 0x20));
  (*pCVar3->_vptr_ClientHook[5])();
  other = kj::_::readMaybe<int>(&local_28);
  kj::_::NullableValue<int>::NullableValue(&local_20,other);
  kj::Maybe<int>::~Maybe(&local_28);
  piVar4 = kj::_::NullableValue::operator_cast_to_int_((NullableValue *)&local_20);
  if (piVar4 != (int *)0x0) {
    piVar4 = kj::_::NullableValue<int>::operator*(&local_20);
    pMVar5 = kj::Own<capnp::MembranePolicy,_std::nullptr_t>::operator->
                       ((Own<capnp::MembranePolicy,_std::nullptr_t> *)(in_RSI + 0x30));
    uVar2 = (*pMVar5->_vptr_MembranePolicy[5])();
    if ((uVar2 & 1) != 0) {
      kj::Maybe<int>::Maybe((Maybe<int> *)this,piVar4);
      bVar1 = true;
      goto LAB_004d2ac1;
    }
  }
  bVar1 = false;
LAB_004d2ac1:
  kj::_::NullableValue<int>::~NullableValue(&local_20);
  if (!bVar1) {
    kj::Maybe<int>::Maybe((Maybe<int> *)this);
  }
  return (Maybe<int>)(NullableValue<int>)this;
}

Assistant:

kj::Maybe<int> getFd() override {
    KJ_IF_SOME(f, inner->getFd()) {
      if (policy->allowFdPassthrough()) {
        return f;
      }
    }
    return kj::none;
  }